

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkeletonMeshBuilder.cpp
# Opt level: O1

aiMesh * __thiscall Assimp::SkeletonMeshBuilder::CreateMesh(SkeletonMeshBuilder *this)

{
  aiVector3D *paVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  pointer paVar5;
  pointer paVar6;
  pointer pFVar7;
  pointer __src;
  pointer ppaVar8;
  aiMesh *paVar9;
  aiVector3D *paVar10;
  ulong *puVar11;
  aiFace *paVar12;
  aiFace *paVar13;
  uint *puVar14;
  aiBone **__dest;
  long lVar15;
  size_t sVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  
  paVar9 = (aiMesh *)operator_new(0x520);
  paVar9->mPrimitiveTypes = 0;
  paVar9->mNumVertices = 0;
  paVar9->mNumFaces = 0;
  memset(&paVar9->mVertices,0,0xcc);
  paVar9->mBones = (aiBone **)0x0;
  paVar9->mMaterialIndex = 0;
  (paVar9->mName).length = 0;
  (paVar9->mName).data[0] = '\0';
  memset((paVar9->mName).data + 1,0x1b,0x3ff);
  paVar9->mNumAnimMeshes = 0;
  paVar9->mAnimMeshes = (aiAnimMesh **)0x0;
  paVar9->mMethod = 0;
  (paVar9->mAABB).mMin.x = 0.0;
  (paVar9->mAABB).mMin.y = 0.0;
  (paVar9->mAABB).mMin.z = 0.0;
  (paVar9->mAABB).mMax.x = 0.0;
  (paVar9->mAABB).mMax.y = 0.0;
  (paVar9->mAABB).mMax.z = 0.0;
  paVar9->mTextureCoords[0] = (aiVector3D *)0x0;
  paVar9->mTextureCoords[1] = (aiVector3D *)0x0;
  paVar9->mTextureCoords[2] = (aiVector3D *)0x0;
  paVar9->mTextureCoords[3] = (aiVector3D *)0x0;
  paVar9->mTextureCoords[4] = (aiVector3D *)0x0;
  paVar9->mTextureCoords[5] = (aiVector3D *)0x0;
  paVar9->mTextureCoords[6] = (aiVector3D *)0x0;
  paVar9->mTextureCoords[7] = (aiVector3D *)0x0;
  paVar9->mNumUVComponents[0] = 0;
  paVar9->mNumUVComponents[1] = 0;
  paVar9->mNumUVComponents[2] = 0;
  paVar9->mNumUVComponents[3] = 0;
  paVar9->mNumUVComponents[4] = 0;
  paVar9->mNumUVComponents[5] = 0;
  paVar9->mNumUVComponents[6] = 0;
  paVar9->mNumUVComponents[7] = 0;
  paVar9->mColors[0] = (aiColor4D *)0x0;
  paVar9->mColors[1] = (aiColor4D *)0x0;
  paVar9->mColors[2] = (aiColor4D *)0x0;
  paVar9->mColors[3] = (aiColor4D *)0x0;
  paVar9->mColors[4] = (aiColor4D *)0x0;
  paVar9->mColors[5] = (aiColor4D *)0x0;
  paVar9->mColors[6] = (aiColor4D *)0x0;
  paVar9->mColors[7] = (aiColor4D *)0x0;
  paVar5 = (this->mVertices).
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  paVar6 = (this->mVertices).
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
  sVar16 = (long)paVar6 - (long)paVar5;
  uVar18 = ((long)sVar16 / 6 + ((long)sVar16 >> 0x3f) >> 1) - ((long)sVar16 >> 0x3f);
  paVar9->mNumVertices = (uint)uVar18;
  uVar19 = uVar18 & 0xffffffff;
  paVar10 = (aiVector3D *)operator_new__(uVar19 * 0xc);
  if (uVar19 != 0) {
    memset(paVar10,0,((uVar19 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
  }
  paVar9->mVertices = paVar10;
  if (paVar6 != paVar5) {
    memmove(paVar10,paVar5,sVar16);
  }
  paVar10 = (aiVector3D *)operator_new__((uVar18 & 0xffffffff) * 0xc);
  if ((uint)uVar18 != 0) {
    memset(paVar10,0,((uVar19 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
  }
  paVar9->mNormals = paVar10;
  uVar19 = ((long)(this->mFaces).
                  super__Vector_base<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->mFaces).
                  super__Vector_base<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
  paVar9->mNumFaces = (uint)uVar19;
  uVar18 = uVar19 & 0xffffffff;
  puVar11 = (ulong *)operator_new__(uVar18 * 0x10 + 8);
  *puVar11 = uVar18;
  paVar12 = (aiFace *)(puVar11 + 1);
  if (uVar18 != 0) {
    paVar13 = paVar12;
    do {
      paVar13->mNumIndices = 0;
      paVar13->mIndices = (uint *)0x0;
      paVar13 = paVar13 + 1;
    } while (paVar13 != paVar12 + uVar18);
  }
  paVar9->mFaces = paVar12;
  if ((uint)uVar19 != 0) {
    lVar17 = 0;
    uVar18 = 0;
    do {
      pFVar7 = (this->mFaces).
               super__Vector_base<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
               ._M_impl.super__Vector_impl_data._M_start;
      paVar12[uVar18].mNumIndices = 3;
      puVar14 = (uint *)operator_new__(0xc);
      puVar11[uVar18 * 2 + 2] = (ulong)puVar14;
      *puVar14 = pFVar7[uVar18].mIndices[0];
      puVar14[1] = pFVar7[uVar18].mIndices[1];
      puVar14[2] = pFVar7[uVar18].mIndices[2];
      uVar2 = pFVar7[uVar18].mIndices[2];
      paVar5 = (this->mVertices).
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar3 = pFVar7[uVar18].mIndices[0];
      uVar4 = pFVar7[uVar18].mIndices[1];
      fVar20 = paVar5[uVar2].x - paVar5[uVar3].x;
      fVar21 = paVar5[uVar2].y - paVar5[uVar3].y;
      fVar26 = paVar5[uVar2].z - paVar5[uVar3].z;
      fVar24 = paVar5[uVar4].x - paVar5[uVar3].x;
      fVar25 = paVar5[uVar4].y - paVar5[uVar3].y;
      fVar22 = paVar5[uVar4].z - paVar5[uVar3].z;
      fVar23 = fVar21 * fVar22 - fVar25 * fVar26;
      fVar22 = fVar26 * fVar24 - fVar22 * fVar20;
      fVar21 = fVar25 * fVar20 - fVar24 * fVar21;
      fVar20 = fVar21 * fVar21 + fVar23 * fVar23 + fVar22 * fVar22;
      if (fVar20 < 0.0) {
        fVar20 = sqrtf(fVar20);
      }
      else {
        fVar20 = SQRT(fVar20);
      }
      fVar24 = 1.0;
      fVar25 = 0.0;
      if (1e-05 <= fVar20) {
        fVar24 = fVar23;
        fVar25 = fVar22;
      }
      fVar22 = 0.0;
      if (1e-05 <= fVar20) {
        fVar22 = fVar21;
      }
      paVar10 = paVar9->mNormals;
      lVar15 = 0;
      do {
        uVar2 = *(uint *)((long)pFVar7->mIndices + lVar15 * 4 + lVar17);
        paVar1 = paVar10 + uVar2;
        paVar1->x = fVar24;
        paVar1->y = fVar25;
        paVar10[uVar2].z = fVar22;
        lVar15 = lVar15 + 1;
      } while (lVar15 != 3);
      uVar18 = uVar18 + 1;
      lVar17 = lVar17 + 0xc;
    } while (uVar18 != (uVar19 & 0xffffffff));
  }
  __src = (this->mBones).super__Vector_base<aiBone_*,_std::allocator<aiBone_*>_>._M_impl.
          super__Vector_impl_data._M_start;
  ppaVar8 = (this->mBones).super__Vector_base<aiBone_*,_std::allocator<aiBone_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  uVar18 = (long)ppaVar8 - (long)__src;
  paVar9->mNumBones = (uint)(uVar18 >> 3);
  __dest = (aiBone **)operator_new__(uVar18 & 0x7fffffff8);
  paVar9->mBones = __dest;
  sVar16 = (long)ppaVar8 - (long)__src;
  if (sVar16 != 0) {
    memmove(__dest,__src,sVar16);
  }
  paVar9->mMaterialIndex = 0;
  return paVar9;
}

Assistant:

aiMesh* SkeletonMeshBuilder::CreateMesh()
{
    aiMesh* mesh = new aiMesh();

    // add points
    mesh->mNumVertices = static_cast<unsigned int>(mVertices.size());
    mesh->mVertices = new aiVector3D[mesh->mNumVertices];
    std::copy( mVertices.begin(), mVertices.end(), mesh->mVertices);

    mesh->mNormals = new aiVector3D[mesh->mNumVertices];

    // add faces
    mesh->mNumFaces = static_cast<unsigned int>(mFaces.size());
    mesh->mFaces = new aiFace[mesh->mNumFaces];
    for( unsigned int a = 0; a < mesh->mNumFaces; a++)
    {
        const Face& inface = mFaces[a];
        aiFace& outface = mesh->mFaces[a];
        outface.mNumIndices = 3;
        outface.mIndices = new unsigned int[3];
        outface.mIndices[0] = inface.mIndices[0];
        outface.mIndices[1] = inface.mIndices[1];
        outface.mIndices[2] = inface.mIndices[2];

        // Compute per-face normals ... we don't want the bones to be smoothed ... they're built to visualize
        // the skeleton, so it's good if there's a visual difference to the rest of the geometry
        aiVector3D nor = ((mVertices[inface.mIndices[2]] - mVertices[inface.mIndices[0]]) ^
            (mVertices[inface.mIndices[1]] - mVertices[inface.mIndices[0]]));

        if (nor.Length() < 1e-5) /* ensure that FindInvalidData won't remove us ...*/
            nor = aiVector3D(1.0,0.0,0.0);

        for (unsigned int n = 0; n < 3; ++n)
            mesh->mNormals[inface.mIndices[n]] = nor;
    }

    // add the bones
    mesh->mNumBones = static_cast<unsigned int>(mBones.size());
    mesh->mBones = new aiBone*[mesh->mNumBones];
    std::copy( mBones.begin(), mBones.end(), mesh->mBones);

    // default
    mesh->mMaterialIndex = 0;

    return mesh;
}